

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

int __thiscall
CVmObjBigNum::setup_getp_retval
          (CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,char **new_ext,size_t prec)

{
  int iVar1;
  vm_obj_id_t obj;
  vm_val_t *this_00;
  char *pcVar2;
  undefined8 *in_RCX;
  vm_val_t *in_RDX;
  vm_obj_id_t in_ESI;
  undefined8 in_R8;
  int in_root_set;
  undefined4 local_4;
  
  in_root_set = (int)((ulong)in_R8 >> 0x20);
  iVar1 = is_nan((char *)0x2b8cca);
  if (iVar1 == 0) {
    this_00 = CVmStack::push();
    vm_val_t::set_obj(this_00,in_ESI);
    obj = create(in_root_set,(size_t)in_RDX);
    vm_val_t::set_obj(in_RDX,obj);
    pcVar2 = get_objid_ext(0);
    *in_RCX = pcVar2;
  }
  else {
    vm_val_t::set_obj(in_RDX,in_ESI);
  }
  local_4 = (uint)(iVar1 != 0);
  return local_4;
}

Assistant:

int CVmObjBigNum::setup_getp_retval(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, char **new_ext,
                                    size_t prec)
{
    /* if I'm not a number, return myself unchanged */
    if (is_nan(ext_))
    {
        retval->set_obj(self);
        return TRUE;
    }

    /* push a self-reference while we're working */
    G_stk->push()->set_obj(self);

    /* create a new number with the same precision as the original */
    retval->set_obj(create(vmg_ FALSE, prec));
    *new_ext = get_objid_ext(vmg_ retval->val.obj);

    /* tell the caller to proceed */
    return FALSE;
}